

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qitemselectionmodel.cpp
# Opt level: O1

void QItemSelectionModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QArrayDataPointer<QItemSelectionRange> *other;
  QArrayDataPointer<QModelIndex> *this;
  long *plVar1;
  bool bVar2;
  __atomic_base<int> _Var3;
  undefined8 *puVar4;
  Data *pDVar5;
  InterfaceType *pIVar6;
  int iVar7;
  QModelIndex *pQVar8;
  InterfaceType *iface;
  long in_FS_OFFSET;
  undefined1 local_60 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> tStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
switchD_0046febd_caseD_2:
  if (_id == 0) {
LAB_004704fe:
    setModel((QItemSelectionModel *)_o,**_a);
  }
  goto switchD_0046febd_caseD_3;
  switch(_id) {
  case 0:
    tStack_50.ptr = (QAbstractItemModel *)_a[1];
    local_48 = (undefined1 *)_a[2];
    iVar7 = 0;
    goto LAB_004700d3;
  case 1:
    tStack_50.ptr = (QAbstractItemModel *)_a[1];
    local_48 = (undefined1 *)_a[2];
    iVar7 = 1;
    goto LAB_004700d3;
  case 2:
    tStack_50.ptr = (QAbstractItemModel *)_a[1];
    local_48 = (undefined1 *)_a[2];
    iVar7 = 2;
    goto LAB_004700d3;
  case 3:
    tStack_50.ptr = (QAbstractItemModel *)_a[1];
    local_48 = (undefined1 *)_a[2];
    iVar7 = 3;
    goto LAB_004700d3;
  case 4:
    local_60._0_8_ = *_a[1];
    tStack_50.ptr = (QAbstractItemModel *)local_60;
    iVar7 = 4;
LAB_004700d3:
    local_60._8_8_ = (QArrayData *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar7,(void **)(local_60 + 8));
    break;
  case 5:
    (*_o->_vptr_QObject[0xc])(_o,_a[1],(ulong)*_a[2]);
    break;
  case 6:
    (*_o->_vptr_QObject[0xd])(_o,_a[1],(ulong)*_a[2]);
    break;
  case 7:
    (*_o->_vptr_QObject[0xe])(_o,_a[1],(ulong)*_a[2]);
    break;
  case 8:
    (*_o->_vptr_QObject[0xf])(_o);
    break;
  case 9:
    (*_o->_vptr_QObject[0x10])(_o);
    break;
  case 10:
    clearSelection((QItemSelectionModel *)_o);
    break;
  case 0xb:
    (*_o->_vptr_QObject[0x11])(_o);
    break;
  case 0xc:
    bVar2 = isSelected((QItemSelectionModel *)_o,(QModelIndex *)_a[1]);
    goto LAB_004701f5;
  case 0xd:
    pQVar8 = (QModelIndex *)_a[2];
    iVar7 = *_a[1];
    goto LAB_00470157;
  case 0xe:
    iVar7 = *_a[1];
    pQVar8 = (QModelIndex *)(local_60 + 8);
    local_60._8_8_ = (QArrayData *)0xffffffffffffffff;
    tStack_50.ptr = (QAbstractItemModel *)0x0;
    local_48 = (undefined1 *)0x0;
LAB_00470157:
    bVar2 = isRowSelected((QItemSelectionModel *)_o,iVar7,pQVar8);
LAB_004701f5:
    if (*_a != (void *)0x0) {
      *(bool *)*_a = bVar2;
    }
    break;
  case 0xf:
    pQVar8 = (QModelIndex *)_a[2];
    iVar7 = *_a[1];
    goto LAB_00470036;
  case 0x10:
    iVar7 = *_a[1];
    pQVar8 = (QModelIndex *)(local_60 + 8);
    local_60._8_8_ = (QArrayData *)0xffffffffffffffff;
    tStack_50.ptr = (QAbstractItemModel *)0x0;
    local_48 = (undefined1 *)0x0;
LAB_00470036:
    bVar2 = isColumnSelected((QItemSelectionModel *)_o,iVar7,pQVar8);
    goto LAB_004701f5;
  case 0x11:
    pQVar8 = (QModelIndex *)_a[2];
    iVar7 = *_a[1];
    goto LAB_00470195;
  case 0x12:
    iVar7 = *_a[1];
    pQVar8 = (QModelIndex *)(local_60 + 8);
    local_60._8_8_ = (QArrayData *)0xffffffffffffffff;
    tStack_50.ptr = (QAbstractItemModel *)0x0;
    local_48 = (undefined1 *)0x0;
LAB_00470195:
    bVar2 = rowIntersectsSelection((QItemSelectionModel *)_o,iVar7,pQVar8);
    goto LAB_004701f5;
  case 0x13:
    pQVar8 = (QModelIndex *)_a[2];
    iVar7 = *_a[1];
    goto LAB_004701ed;
  case 0x14:
    iVar7 = *_a[1];
    pQVar8 = (QModelIndex *)(local_60 + 8);
    local_60._8_8_ = (QArrayData *)0xffffffffffffffff;
    tStack_50.ptr = (QAbstractItemModel *)0x0;
    local_48 = (undefined1 *)0x0;
LAB_004701ed:
    bVar2 = columnIntersectsSelection((QItemSelectionModel *)_o,iVar7,pQVar8);
    goto LAB_004701f5;
  case 0x15:
    iVar7 = *_a[1];
    goto LAB_004701dc;
  case 0x16:
    iVar7 = 0;
LAB_004701dc:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    tStack_50.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    selectedRows((QModelIndexList *)(local_60 + 8),(QItemSelectionModel *)_o,iVar7);
LAB_0047022c:
    if ((QArrayDataPointer<QModelIndex> *)*_a != (QArrayDataPointer<QModelIndex> *)0x0) {
      QArrayDataPointer<QModelIndex>::operator=
                ((QArrayDataPointer<QModelIndex> *)*_a,
                 (QArrayDataPointer<QModelIndex> *)(local_60 + 8));
    }
    if ((QArrayData *)local_60._8_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_60._8_8_,0x18,0x10);
      }
    }
    break;
  case 0x17:
    iVar7 = *_a[1];
    goto LAB_00470227;
  case 0x18:
    iVar7 = 0;
LAB_00470227:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    tStack_50.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_60._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    selectedColumns((QModelIndexList *)(local_60 + 8),(QItemSelectionModel *)_o,iVar7);
    goto LAB_0047022c;
  }
  if (_c != IndexOfMethod) {
    if (_c == RegisterPropertyMetaType) goto switchD_0046febd_caseD_6;
    if (_c != RegisterMethodArgumentMetaType) goto LAB_00470407;
    if (_id == 0) {
      puVar4 = (undefined8 *)*_a;
      if (1 < *_a[1]) goto LAB_004702cb;
LAB_004702bc:
      pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType;
LAB_004702c3:
      *puVar4 = pIVar6;
    }
    else {
      if (_id == 4) {
        puVar4 = (undefined8 *)*_a;
        if (*_a[1] == 0) {
          pIVar6 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
          goto LAB_004702c3;
        }
      }
      else if (_id == 7) {
        puVar4 = (undefined8 *)*_a;
        if (*_a[1] == 0) goto LAB_004702bc;
      }
      else {
        puVar4 = (undefined8 *)*_a;
      }
LAB_004702cb:
      *puVar4 = 0;
    }
    switch(_c) {
    case ReadProperty:
      goto switchD_0046febd_caseD_1;
    case WriteProperty:
      goto switchD_0046febd_caseD_2;
    default:
      goto switchD_0046febd_caseD_3;
    case IndexOfMethod:
      break;
    case RegisterPropertyMetaType:
      goto switchD_0046febd_caseD_6;
    }
  }
  plVar1 = (long *)_a[1];
  if (((code *)*plVar1 == selectionChanged) && (plVar1[1] == 0)) {
    *(undefined4 *)*_a = 0;
    goto LAB_0047052e;
  }
  if (((code *)*plVar1 == currentChanged) && (plVar1[1] == 0)) {
    *(undefined4 *)*_a = 1;
    goto LAB_0047052e;
  }
  if (((code *)*plVar1 == currentRowChanged) && (plVar1[1] == 0)) {
    *(undefined4 *)*_a = 2;
    goto LAB_0047052e;
  }
  if (((code *)*plVar1 == currentColumnChanged) && (plVar1[1] == 0)) {
    *(undefined4 *)*_a = 3;
    goto LAB_0047052e;
  }
  if (((code *)*plVar1 == modelChanged) && (plVar1[1] == 0)) {
    *(undefined4 *)*_a = 4;
    goto LAB_0047052e;
  }
  if (_c == ReadProperty) goto switchD_0046febd_caseD_1;
  if (_c == WriteProperty) goto switchD_0046febd_caseD_2;
  if (_c != RegisterPropertyMetaType) goto switchD_0046febd_caseD_3;
switchD_0046febd_caseD_6:
  if (_id == 4) {
    _Var3._M_i = (__int_type_conflict)
                 QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType.typeId._q_value
                 .super___atomic_base<int>._M_i;
    if ((__atomic_base<int>)
        QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType.typeId._q_value.
        super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
      iface = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QModelIndex>_>::metaType;
      goto LAB_004703fd;
    }
  }
  else if (_id == 3) {
    _Var3._M_i = (__int_type_conflict)
                 QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType.typeId._q_value.
                 super___atomic_base<int>._M_i;
    if ((__atomic_base<int>)
        QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType.typeId._q_value.
        super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
      iface = &QtPrivate::QMetaTypeInterfaceWrapper<QItemSelection>::metaType;
      goto LAB_004703fd;
    }
  }
  else {
    _Var3._M_i = -1;
    if ((_id == 0) &&
       (_Var3._M_i = (__int_type_conflict)
                     QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId.
                     _q_value.super___atomic_base<int>._M_i,
       (__atomic_base<int>)
       QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
       super___atomic_base<int>._M_i == (__atomic_base<int>)0x0)) {
      iface = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
LAB_004703fd:
      _Var3._M_i = QMetaType::registerHelper(iface);
    }
  }
  ((__atomic_base<int> *)*_a)->_M_i = _Var3._M_i;
LAB_00470407:
  if (_c == WriteProperty) goto switchD_0046febd_caseD_2;
  if (_c == ReadProperty) {
switchD_0046febd_caseD_1:
    if ((uint)_id < 5) {
      this = (QArrayDataPointer<QModelIndex> *)*_a;
      switch(_id) {
      case 0:
        pDVar5 = (Data *)QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                         ::value((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                                  *)&(_o->d_ptr).d[1].children.d.size);
        this->d = pDVar5;
        break;
      case 1:
        bVar2 = hasSelection((QItemSelectionModel *)_o);
        *(bool *)&this->d = bVar2;
        break;
      case 2:
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  ((QPersistentModelIndex *)&(_o->d_ptr).d[2].parent);
        this->size = (qsizetype)local_48;
        this->d = (Data *)local_60._8_8_;
        this->ptr = (QModelIndex *)tStack_50.ptr;
        break;
      case 3:
        other = (QArrayDataPointer<QItemSelectionRange> *)(local_60 + 8);
        selection((QItemSelection *)other,(QItemSelectionModel *)_o);
        QArrayDataPointer<QItemSelectionRange>::operator=
                  ((QArrayDataPointer<QItemSelectionRange> *)this,other);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(other);
        break;
      case 4:
        selectedIndexes((QModelIndexList *)(local_60 + 8),(QItemSelectionModel *)_o);
        QArrayDataPointer<QModelIndex>::operator=
                  (this,(QArrayDataPointer<QModelIndex> *)(local_60 + 8));
        if ((QArrayData *)local_60._8_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_60._8_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_60._8_8_,0x18,0x10);
          }
        }
      }
    }
    if (_c != WriteProperty || _id != 0) goto switchD_0046febd_caseD_3;
    goto LAB_004704fe;
  }
switchD_0046febd_caseD_3:
  if (_c == BindableProperty && _id == 0) {
    plVar1 = (long *)*_a;
    *plVar1 = (long)&(_o->d_ptr).d[1].children.d.size;
    plVar1[1] = (long)&QtPrivate::
                       QBindableInterfaceForProperty<QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>,_void>
                       ::iface;
  }
LAB_0047052e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QItemSelectionModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->selectionChanged((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[2]))); break;
        case 1: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 2: _t->currentRowChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 3: _t->currentColumnChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 4: _t->modelChanged((*reinterpret_cast< std::add_pointer_t<QAbstractItemModel*>>(_a[1]))); break;
        case 5: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 6: _t->select((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 7: _t->select((*reinterpret_cast< std::add_pointer_t<QItemSelection>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QItemSelectionModel::SelectionFlags>>(_a[2]))); break;
        case 8: _t->clear(); break;
        case 9: _t->reset(); break;
        case 10: _t->clearSelection(); break;
        case 11: _t->clearCurrentIndex(); break;
        case 12: { bool _r = _t->isSelected((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 13: { bool _r = _t->isRowSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 14: { bool _r = _t->isRowSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 15: { bool _r = _t->isColumnSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 16: { bool _r = _t->isColumnSelected((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 17: { bool _r = _t->rowIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 18: { bool _r = _t->rowIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 19: { bool _r = _t->columnIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 20: { bool _r = _t->columnIntersectsSelection((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< bool*>(_a[0]) = std::move(_r); }  break;
        case 21: { QModelIndexList _r = _t->selectedRows((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 22: { QModelIndexList _r = _t->selectedRows();
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 23: { QModelIndexList _r = _t->selectedColumns((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        case 24: { QModelIndexList _r = _t->selectedColumns();
            if (_a[0]) *reinterpret_cast< QModelIndexList*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 1:
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractItemModel* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QItemSelection >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QItemSelection & , const QItemSelection & )>(_a, &QItemSelectionModel::selectionChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentRowChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(const QModelIndex & , const QModelIndex & )>(_a, &QItemSelectionModel::currentColumnChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QItemSelectionModel::*)(QAbstractItemModel * )>(_a, &QItemSelectionModel::modelChanged, 4))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QAbstractItemModel* >(); break;
        case 3:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QItemSelection >(); break;
        case 4:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QModelIndexList >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QAbstractItemModel**>(_v) = _t->model(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->hasSelection(); break;
        case 2: *reinterpret_cast<QModelIndex*>(_v) = _t->currentIndex(); break;
        case 3: *reinterpret_cast<QItemSelection*>(_v) = _t->selection(); break;
        case 4: *reinterpret_cast<QModelIndexList*>(_v) = _t->selectedIndexes(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setModel(*reinterpret_cast<QAbstractItemModel**>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableModel(); break;
        default: break;
        }
    }
}